

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

void set_spatial_segment_id
               (CommonModeInfoParams *mi_params,uint8_t *segment_ids,BLOCK_SIZE bsize,int mi_row,
               int mi_col,uint8_t segment_id)

{
  uint y_mis;
  uint mi_offset_00;
  int in_ECX;
  byte in_DL;
  long in_RDI;
  int in_R8D;
  int mi_stride;
  int ymis;
  int xmis;
  int bh;
  int bw;
  int mi_offset;
  uint8_t in_stack_ffffffffffffffbf;
  
  y_mis = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[in_DL];
  mi_offset_00 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                       [in_DL];
  if (*(int *)(in_RDI + 0x10) - in_R8D < (int)y_mis) {
    y_mis = *(int *)(in_RDI + 0x10) - in_R8D;
  }
  if (*(int *)(in_RDI + 0xc) - in_ECX < (int)mi_offset_00) {
    mi_offset_00 = *(int *)(in_RDI + 0xc) - in_ECX;
  }
  set_segment_id((uint8_t *)
                 (ulong)CONCAT14("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                                 [in_DL],y_mis),mi_offset_00,*(int *)(in_RDI + 0x10),y_mis,
                 mi_offset_00,in_stack_ffffffffffffffbf);
  return;
}

Assistant:

static inline void set_spatial_segment_id(
    const CommonModeInfoParams *const mi_params, uint8_t *segment_ids,
    BLOCK_SIZE bsize, int mi_row, int mi_col, uint8_t segment_id) {
  const int mi_offset = mi_row * mi_params->mi_cols + mi_col;
  const int bw = mi_size_wide[bsize];
  const int bh = mi_size_high[bsize];
  const int xmis = AOMMIN(mi_params->mi_cols - mi_col, bw);
  const int ymis = AOMMIN(mi_params->mi_rows - mi_row, bh);

  const int mi_stride = mi_params->mi_cols;

  set_segment_id(segment_ids, mi_offset, xmis, ymis, mi_stride, segment_id);
}